

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O1

void anon_unknown.dwarf_3a15::modtest(int base,int test)

{
  ulong byteCount;
  bool bVar1;
  bool bVar2;
  int iVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  clock_t cVar7;
  pointer pBVar8;
  undefined4 in_register_0000003c;
  pointer pBVar9;
  pointer pBVar10;
  vector<BN,_std::allocator<BN>_> g;
  vector<BN,_std::allocator<BN>_> mod;
  vector<BN,_std::allocator<BN>_> exp;
  BN m;
  vector<BN,_std::allocator<BN>_> local_148;
  undefined8 local_130;
  vector<BN,_std::allocator<BN>_> local_128;
  vector<BN,_std::allocator<BN>_> local_108;
  BN local_f0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  local_130 = CONCAT44(in_register_0000003c,base);
  local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (BN *)0x0;
  local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_108.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar3 = 0;
  local_128.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_128.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (0 < test) {
    byteCount = (ulong)(uint)base;
    do {
      BN::makeRandom(&local_f0,byteCount);
      std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_148,&local_f0);
      if (local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      BN::makeRandom(&local_f0,byteCount);
      std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_108,&local_f0);
      if (local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      BN::makeRandom(&local_f0,byteCount);
      while( true ) {
        bVar1 = BN::is0(&local_f0);
        bVar2 = true;
        if (!bVar1) {
          BN::BN(&local_d8,&local_f0);
          BN::BN(&local_a8,0x10000);
          gcdBinary(&local_c0,&local_d8,&local_a8);
          BN::BN(&local_48,1);
          bVar2 = BN::operator!=(&local_c0,&local_48);
          if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (bVar2 == false) break;
        BN::makeRandom(&local_60,byteCount);
        BN::operator=(&local_f0,&local_60);
        if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      std::vector<BN,_std::allocator<BN>_>::push_back(&local_128,&local_f0);
      if (local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != test);
  }
  cVar4 = clock();
  if (local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pBVar8 = local_108.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar10 = local_128.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      BN::PowMod(&local_78,pBVar9,pBVar8,pBVar10);
      if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pBVar9 = pBVar9 + 1;
      pBVar8 = pBVar8 + 1;
      pBVar10 = pBVar10 + 1;
    } while (pBVar9 != local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  cVar5 = clock();
  cVar6 = clock();
  if (local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pBVar8 = local_108.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar10 = local_128.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      BN::PowModBarrett(&local_90,pBVar9,pBVar8,pBVar10);
      if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pBVar9 = pBVar9 + 1;
      pBVar8 = pBVar8 + 1;
      pBVar10 = pBVar10 + 1;
    } while (pBVar9 != local_148.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  cVar7 = clock();
  printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",
         SUB84((double)((float)(ulong)(cVar5 - cVar4) / ((float)test * 1000.0)),0),
         (double)((float)(ulong)(cVar7 - cVar6) / ((float)test * 1000.0)),local_130,
         (ulong)(uint)((int)local_130 * 8));
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_128);
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_108);
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_148);
  return;
}

Assistant:

void modtest(int base,int test) {
    uint64_t t;
    vector <BN> g;
    vector <BN> exp;
    vector <BN> mod;


    for(int i=0;i<test;i++) {
        g.push_back(BN::makeRandom(base));
        exp.push_back(BN::makeRandom(base));
        BN m(BN::makeRandom(base));
        while (m.is0() || (gcdBinary(m, (BN)bsize) != (BN) 1))
            m = BN::makeRandom(base);
        mod.push_back( m );
    }

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowMod(*j, *k);
    float t1 = clock() - t;

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowModBarrett(*j, *k);
    float t2 = clock() - t;

    float diviser = 1000.0 * test;
    t1 /= diviser;
    t2 /= diviser;

    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",base,(int)(base*8),test, t1, t2);
}